

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int magma_cipher_do_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  if (in == (uchar *)0x0 && inl == 0) {
    iVar1 = gost2015_final_call(ctx,*(EVP_MD_CTX **)(lVar3 + 0x1080),8,(uchar *)(lVar3 + 0x14),
                                magma_cipher_do_ctr);
    return iVar1;
  }
  iVar1 = -1;
  if (in != (uchar *)0x0) {
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 != 0) {
      EVP_DigestSignUpdate(*(undefined8 *)(lVar3 + 0x1080),in,inl);
    }
    iVar2 = magma_cipher_do_ctr(ctx,out,in,inl);
    if ((long)iVar2 == inl) {
      iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
      if (iVar1 == 0) {
        EVP_DigestSignUpdate(*(undefined8 *)(lVar3 + 0x1080),out,inl);
      }
      iVar1 = (int)inl;
    }
  }
  return iVar1;
}

Assistant:

static int magma_cipher_do_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx, unsigned char *out,
                               const unsigned char *in, size_t inl)
{
  struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);

	if (in == NULL && inl == 0) /* Final call */
		return gost2015_final_call(ctx, c->omac_ctx, MAGMA_MAC_MAX_SIZE, c->tag, magma_cipher_do_ctr);

  if (in == NULL)
      return -1;

	/* As in and out can be the same pointer, process unencrypted here */
	if (EVP_CIPHER_CTX_encrypting(ctx))
		EVP_DigestSignUpdate(c->omac_ctx, in, inl);

  if (magma_cipher_do_ctr(ctx, out, in, inl) != inl)
      return -1;

	/* As in and out can be the same pointer, process decrypted here */
	if (!EVP_CIPHER_CTX_encrypting(ctx))
		EVP_DigestSignUpdate(c->omac_ctx, out, inl);

	return inl;
}